

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O1

void __thiscall
pbrt::PixelStatsAccumulator::ReportRatio
          (PixelStatsAccumulator *this,Point2i *p,int statIndex,char *name,int64_t num,int64_t denom
          )

{
  Image *this_00;
  PixelStats *pPVar1;
  pointer pbVar2;
  char *pcVar3;
  pointer pIVar4;
  Tuple2<pbrt::Point2,_int> TVar5;
  Allocator alloc;
  ulong uVar6;
  int iVar7;
  long lVar8;
  Point2i resolution;
  long *plVar9;
  Point2i p_00;
  int iVar10;
  ulong uVar11;
  Float FVar12;
  Float FVar13;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  ColorEncodingHandle local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  undefined1 *local_188 [2];
  undefined1 local_178 [16];
  long *local_168 [2];
  long local_158 [2];
  Image local_148;
  
  uVar11 = (ulong)statIndex;
  pPVar1 = this->stats;
  uVar6 = ((long)(pPVar1->ratioImages).super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(pPVar1->ratioImages).super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5075075075075075;
  if (uVar6 < uVar11 || uVar6 - uVar11 == 0) {
    std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::resize
              (&pPVar1->ratioImages,(long)(statIndex + 1));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&this->stats->ratioNames,(long)(statIndex + 1));
    pbVar2 = (this->stats->ratioNames).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar3 = (char *)pbVar2[uVar11]._M_string_length;
    strlen(name);
    std::__cxx11::string::_M_replace((ulong)(pbVar2 + uVar11),0,pcVar3,(ulong)name);
  }
  pIVar4 = (this->stats->ratioImages).super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
           _M_impl.super__Vector_impl_data._M_start;
  this_00 = pIVar4 + uVar11;
  iVar7 = imageBounds._8_4_ - imageBounds._0_4_;
  iVar10 = imageBounds._12_4_ - imageBounds._4_4_;
  TVar5 = pIVar4[uVar11].resolution.super_Tuple2<pbrt::Point2,_int>;
  if (TVar5.y != iVar10 || TVar5.x != iVar7) {
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"numerator","");
    local_188[0] = local_178;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"denominator","");
    plVar9 = local_158;
    local_168[0] = plVar9;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"ratio","");
    resolution.super_Tuple2<pbrt::Point2,_int>.y = iVar10;
    resolution.super_Tuple2<pbrt::Point2,_int>.x = iVar7;
    local_1b0.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )0;
    alloc.memoryResource = pstd::pmr::new_delete_resource();
    channels.n = 3;
    channels.ptr = &local_1a8;
    Image::Image(&local_148,Float,resolution,channels,&local_1b0,alloc);
    (this_00->resolution).super_Tuple2<pbrt::Point2,_int>.y =
         local_148.resolution.super_Tuple2<pbrt::Point2,_int>.y;
    this_00->format = local_148.format;
    (this_00->resolution).super_Tuple2<pbrt::Point2,_int>.x =
         local_148.resolution.super_Tuple2<pbrt::Point2,_int>.x;
    InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this_00->channelNames,&local_148.channelNames);
    (this_00->encoding).
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (uintptr_t)
            local_148.encoding.
            super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
            .bits;
    pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
              (&this_00->p8,&local_148.p8);
    pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
              (&this_00->p16,&local_148.p16);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
              (&this_00->p32,&local_148.p32);
    local_148.p32.nStored = 0;
    (*(local_148.p32.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_148.p32.alloc.memoryResource,local_148.p32.ptr,local_148.p32.nAlloc << 2,4);
    local_148.p16.nStored = 0;
    (*(local_148.p16.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_148.p16.alloc.memoryResource,local_148.p16.ptr,local_148.p16.nAlloc * 2,2);
    local_148.p8.nStored = 0;
    (*(local_148.p8.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_148.p8.alloc.memoryResource,local_148.p8.ptr,local_148.p8.nAlloc,1);
    InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~InlinedVector(&local_148.channelNames);
    lVar8 = -0x60;
    do {
      if (plVar9 != (long *)plVar9[-2]) {
        operator_delete((long *)plVar9[-2],*plVar9 + 1);
      }
      plVar9 = plVar9 + -4;
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0);
  }
  p_00.super_Tuple2<pbrt::Point2,_int>.x =
       (p->super_Tuple2<pbrt::Point2,_int>).x - imageBounds._0_4_;
  p_00.super_Tuple2<pbrt::Point2,_int>.y =
       (p->super_Tuple2<pbrt::Point2,_int>).y - imageBounds._4_4_;
  FVar12 = Image::GetChannel(this_00,p_00,0,(WrapMode2D)0x200000002);
  Image::SetChannel(this_00,p_00,0,FVar12 + (float)num);
  FVar12 = Image::GetChannel(this_00,p_00,1,(WrapMode2D)0x200000002);
  Image::SetChannel(this_00,p_00,1,FVar12 + (float)denom);
  FVar12 = Image::GetChannel(this_00,p_00,0,(WrapMode2D)0x200000002);
  FVar13 = 0.0;
  if ((FVar12 != 0.0) || (NAN(FVar12))) {
    FVar13 = Image::GetChannel(this_00,p_00,0,(WrapMode2D)0x200000002);
    FVar12 = Image::GetChannel(this_00,p_00,1,(WrapMode2D)0x200000002);
    FVar13 = FVar13 / FVar12;
  }
  Image::SetChannel(this_00,p_00,2,FVar13);
  return;
}

Assistant:

void PixelStatsAccumulator::ReportRatio(const Point2i &p, int statIndex, const char *name,
                                        int64_t num, int64_t denom) {
    if (statIndex >= stats->ratioImages.size()) {
        stats->ratioImages.resize(statIndex + 1);
        stats->ratioNames.resize(statIndex + 1);
        stats->ratioNames[statIndex] = name;
    }

    Image &im = stats->ratioImages[statIndex];
    Point2i res = Point2i(imageBounds.Diagonal());
    if (im.Resolution() != res)
        im = Image(PixelFormat::Float, res, {"numerator", "denominator", "ratio"});

    Point2i pp = Point2i(p - imageBounds.pMin);
    im.SetChannel(pp, 0, im.GetChannel(pp, 0) + num);
    im.SetChannel(pp, 1, im.GetChannel(pp, 1) + denom);
    if (im.GetChannel(pp, 0) == 0)
        im.SetChannel(pp, 2, 0);
    else
        im.SetChannel(pp, 2, im.GetChannel(pp, 0) / im.GetChannel(pp, 1));
}